

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

gzFile gz_open(char *path,char *mode,int fd)

{
  int iVar1;
  uLong uVar2;
  size_t sVar3;
  char *pcVar4;
  Byte *pBVar5;
  int *piVar6;
  long lVar7;
  ulong in_stack_ffffffffffffff18;
  FILE *local_b0;
  bool local_a1;
  char **local_a0;
  char *m;
  char fmode [80];
  gz_stream *s;
  char *p;
  int strategy;
  int level;
  int err;
  int fd_local;
  char *mode_local;
  char *path_local;
  
  p._4_4_ = -1;
  p._0_4_ = 0;
  local_a0 = &m;
  if ((path == (char *)0x0) || (mode == (char *)0x0)) {
    path_local = (char *)0x0;
  }
  else {
    path_local = (char *)malloc(0xd0);
    if ((gz_stream *)path_local == (gz_stream *)0x0) {
      path_local = (char *)0x0;
    }
    else {
      (((gz_stream *)path_local)->stream).zalloc = (alloc_func)0x0;
      (((gz_stream *)path_local)->stream).zfree = (free_func)0x0;
      (((gz_stream *)path_local)->stream).opaque = (voidpf)0x0;
      ((gz_stream *)path_local)->inbuf = (Byte *)0x0;
      (((gz_stream *)path_local)->stream).next_in = (Bytef *)0x0;
      ((gz_stream *)path_local)->outbuf = (Byte *)0x0;
      (((gz_stream *)path_local)->stream).next_out = (Bytef *)0x0;
      (((gz_stream *)path_local)->stream).avail_out = 0;
      (((gz_stream *)path_local)->stream).avail_in = 0;
      ((gz_stream *)path_local)->file = (FILE *)0x0;
      ((gz_stream *)path_local)->z_err = 0;
      ((gz_stream *)path_local)->z_eof = 0;
      ((gz_stream *)path_local)->in = 0;
      ((gz_stream *)path_local)->out = 0;
      ((gz_stream *)path_local)->back = -1;
      uVar2 = cm_zlib_crc32(0,(uchar *)0x0,0);
      ((gz_stream *)path_local)->crc = uVar2;
      ((gz_stream *)path_local)->msg = (char *)0x0;
      ((gz_stream *)path_local)->transparent = 0;
      sVar3 = strlen(path);
      pcVar4 = (char *)malloc(sVar3 + 1);
      ((gz_stream *)path_local)->path = pcVar4;
      if (((gz_stream *)path_local)->path == (char *)0x0) {
        destroy((gz_stream *)path_local);
        path_local = (char *)0x0;
      }
      else {
        strcpy(((gz_stream *)path_local)->path,path);
        ((gz_stream *)path_local)->mode = '\0';
        s = (gz_stream *)mode;
        do {
          if (*(char *)&(s->stream).next_in == 'r') {
            ((gz_stream *)path_local)->mode = 'r';
          }
          if ((*(char *)&(s->stream).next_in == 'w') || (*(char *)&(s->stream).next_in == 'a')) {
            ((gz_stream *)path_local)->mode = 'w';
          }
          if ((*(char *)&(s->stream).next_in < '0') || ('9' < *(char *)&(s->stream).next_in)) {
            if (*(char *)&(s->stream).next_in == 'f') {
              p._0_4_ = 1;
            }
            else if (*(char *)&(s->stream).next_in == 'h') {
              p._0_4_ = 2;
            }
            else if (*(char *)&(s->stream).next_in == 'R') {
              p._0_4_ = 3;
            }
            else {
              *(undefined1 *)local_a0 = *(undefined1 *)&(s->stream).next_in;
              local_a0 = (char **)((long)local_a0 + 1);
            }
          }
          else {
            p._4_4_ = *(char *)&(s->stream).next_in + -0x30;
          }
          local_a1 = *(char *)&(s->stream).next_in != '\0' && local_a0 != (char **)(fmode + 0x48);
          s = (gz_stream *)((long)&(s->stream).next_in + 1);
        } while (local_a1);
        if (((gz_stream *)path_local)->mode == '\0') {
          destroy((gz_stream *)path_local);
          path_local = (char *)0x0;
        }
        else {
          if (((gz_stream *)path_local)->mode == 'w') {
            in_stack_ffffffffffffff18 = 0;
            iVar1 = cm_zlib_deflateInit2_
                              ((z_streamp)path_local,p._4_4_,8,-0xf,8,(int)p,"1.2.3",0x70);
            pBVar5 = (Byte *)malloc(0x4000);
            ((gz_stream *)path_local)->outbuf = pBVar5;
            (((gz_stream *)path_local)->stream).next_out = pBVar5;
            if ((iVar1 != 0) || (((gz_stream *)path_local)->outbuf == (Byte *)0x0)) {
              destroy((gz_stream *)path_local);
              return (gzFile)0x0;
            }
          }
          else {
            pBVar5 = (Byte *)malloc(0x4000);
            ((gz_stream *)path_local)->inbuf = pBVar5;
            (((gz_stream *)path_local)->stream).next_in = pBVar5;
            iVar1 = cm_zlib_inflateInit2_((z_streamp_conflict)path_local,-0xf,"1.2.3",0x70);
            if ((iVar1 != 0) || (((gz_stream *)path_local)->inbuf == (Byte *)0x0)) {
              destroy((gz_stream *)path_local);
              return (gzFile)0x0;
            }
          }
          (((gz_stream *)path_local)->stream).avail_out = 0x4000;
          piVar6 = __errno_location();
          *piVar6 = 0;
          if (fd < 0) {
            local_b0 = fopen(path,(char *)&m);
          }
          else {
            local_b0 = fdopen(fd,(char *)&m);
          }
          ((gz_stream *)path_local)->file = (FILE *)local_b0;
          if (((gz_stream *)path_local)->file == (FILE *)0x0) {
            destroy((gz_stream *)path_local);
            path_local = (char *)0x0;
          }
          else if (((gz_stream *)path_local)->mode == 'w') {
            fprintf((FILE *)((gz_stream *)path_local)->file,"%c%c%c%c%c%c%c%c%c%c",0x1f,0x8b,8,0,
                    in_stack_ffffffffffffff18 & 0xffffffff00000000,0,0,0,0,3);
            ((gz_stream *)path_local)->start = 10;
          }
          else {
            check_header((gz_stream *)path_local);
            lVar7 = ftell((FILE *)((gz_stream *)path_local)->file);
            ((gz_stream *)path_local)->start =
                 lVar7 - (ulong)(((gz_stream *)path_local)->stream).avail_in;
          }
        }
      }
    }
  }
  return path_local;
}

Assistant:

local gzFile gz_open (path, mode, fd)
    const char *path;
    const char *mode;
    int  fd;
{
    int err;
    int level = Z_DEFAULT_COMPRESSION; /* compression level */
    int strategy = Z_DEFAULT_STRATEGY; /* compression strategy */
    char *p = (char*)mode;
    gz_stream *s;
    char fmode[80]; /* copy of mode, without the compression level */
    char *m = fmode;

    if (!path || !mode) return Z_NULL;

    s = (gz_stream *)ALLOC(sizeof(gz_stream));
    if (!s) return Z_NULL;

    s->stream.zalloc = (alloc_func)0;
    s->stream.zfree = (free_func)0;
    s->stream.opaque = (voidpf)0;
    s->stream.next_in = s->inbuf = Z_NULL;
    s->stream.next_out = s->outbuf = Z_NULL;
    s->stream.avail_in = s->stream.avail_out = 0;
    s->file = NULL;
    s->z_err = Z_OK;
    s->z_eof = 0;
    s->in = 0;
    s->out = 0;
    s->back = EOF;
    s->crc = crc32(0L, Z_NULL, 0);
    s->msg = NULL;
    s->transparent = 0;

    s->path = (char*)ALLOC(strlen(path)+1);
    if (s->path == NULL) {
        return destroy(s), (gzFile)Z_NULL;
    }
    strcpy(s->path, path); /* do this early for debugging */

    s->mode = '\0';
    do {
        if (*p == 'r') s->mode = 'r';
        if (*p == 'w' || *p == 'a') s->mode = 'w';
        if (*p >= '0' && *p <= '9') {
            level = *p - '0';
        } else if (*p == 'f') {
          strategy = Z_FILTERED;
        } else if (*p == 'h') {
          strategy = Z_HUFFMAN_ONLY;
        } else if (*p == 'R') {
          strategy = Z_RLE;
        } else {
            *m++ = *p; /* copy the mode */
        }
    } while (*p++ && m != fmode + sizeof(fmode));
    if (s->mode == '\0') return destroy(s), (gzFile)Z_NULL;

    if (s->mode == 'w') {
#ifdef NO_GZCOMPRESS
        err = Z_STREAM_ERROR;
#else
        err = deflateInit2(&(s->stream), level,
                           Z_DEFLATED, -MAX_WBITS, DEF_MEM_LEVEL, strategy);
        /* windowBits is passed < 0 to suppress zlib header */

        s->stream.next_out = s->outbuf = (Byte*)ALLOC(Z_BUFSIZE);
#endif
        if (err != Z_OK || s->outbuf == Z_NULL) {
            return destroy(s), (gzFile)Z_NULL;
        }
    } else {
        s->stream.next_in  = s->inbuf = (Byte*)ALLOC(Z_BUFSIZE);

        err = inflateInit2(&(s->stream), -MAX_WBITS);
        /* windowBits is passed < 0 to tell that there is no zlib header.
         * Note that in this case inflate *requires* an extra "dummy" byte
         * after the compressed stream in order to complete decompression and
         * return Z_STREAM_END. Here the gzip CRC32 ensures that 4 bytes are
         * present after the compressed stream.
         */
        if (err != Z_OK || s->inbuf == Z_NULL) {
            return destroy(s), (gzFile)Z_NULL;
        }
    }
    s->stream.avail_out = Z_BUFSIZE;

    errno = 0;
    s->file = fd < 0 ? F_OPEN(path, fmode) : (FILE*)fdopen(fd, fmode);

    if (s->file == NULL) {
        return destroy(s), (gzFile)Z_NULL;
    }
    if (s->mode == 'w') {
        /* Write a very simple .gz header:
         */
        fprintf(s->file, "%c%c%c%c%c%c%c%c%c%c", gz_magic[0], gz_magic[1],
             Z_DEFLATED, 0 /*flags*/, 0,0,0,0 /*time*/, 0 /*xflags*/, OS_CODE);
        s->start = 10L;
        /* We use 10L instead of ftell(s->file) to because ftell causes an
         * fflush on some systems. This version of the library doesn't use
         * start anyway in write mode, so this initialization is not
         * necessary.
         */
    } else {
        check_header(s); /* skip the .gz header */
        s->start = ftell(s->file) - s->stream.avail_in;
    }

    return (gzFile)s;
}